

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O3

vector<duckdb::LogicalIndex,_true> * __thiscall
duckdb::ColumnDependencyManager::CleanupInternals
          (vector<duckdb::LogicalIndex,_true> *__return_storage_ptr__,ColumnDependencyManager *this,
          idx_t column_amount)

{
  size_type __n;
  iterator iVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  _Hash_node_base *__n_00;
  LogicalIndex *col;
  long lVar5;
  LogicalIndex *pLVar6;
  LogicalIndex current_index;
  vector<duckdb::LogicalIndex,_true> to_adjust;
  allocator_type local_61;
  value_type local_60;
  LogicalIndex *local_58;
  iterator iStack_50;
  LogicalIndex *local_48;
  _Hash_node_base *local_38;
  
  local_58 = (LogicalIndex *)0x0;
  iStack_50._M_current = (LogicalIndex *)0x0;
  local_48 = (LogicalIndex *)0x0;
  local_60.index = 0xffffffffffffffff;
  ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,
             column_amount,&local_60,&local_61);
  if (column_amount != 0) {
    local_38 = (this->deleted_columns)._M_h._M_before_begin._M_nxt[1]._M_nxt;
    lVar5 = 0;
    __n_00 = (_Hash_node_base *)0x0;
    do {
      local_60.index = (idx_t)__n_00;
      pvVar3 = vector<duckdb::LogicalIndex,_true>::operator[]
                         (__return_storage_ptr__,(size_type)__n_00);
      pvVar3->index = (long)__n_00 - lVar5;
      sVar4 = ::std::
              _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&(this->deleted_columns)._M_h,&local_60);
      if (sVar4 == 0) {
        if ((local_38 < __n_00) &&
           ((bVar2 = HasDependencies(this,(LogicalIndex)local_60.index), bVar2 ||
            (bVar2 = HasDependents(this,(LogicalIndex)local_60.index), bVar2)))) {
          if (iStack_50._M_current == local_48) {
            ::std::vector<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>>::
            _M_realloc_insert<duckdb::LogicalIndex_const&>
                      ((vector<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *)
                       &local_58,iStack_50,&local_60);
          }
          else {
            (iStack_50._M_current)->index = local_60.index;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
      else {
        lVar5 = lVar5 + 1;
      }
      iVar1._M_current = (LogicalIndex *)iStack_50;
      __n_00 = (_Hash_node_base *)((long)&__n_00->_M_nxt + 1);
      pLVar6 = local_58;
    } while ((_Hash_node_base *)column_amount != __n_00);
    for (; pLVar6 != iVar1._M_current; pLVar6 = pLVar6 + 1) {
      __n = pLVar6->index;
      pvVar3 = vector<duckdb::LogicalIndex,_true>::operator[](__return_storage_ptr__,__n);
      AdjustSingle(this,(LogicalIndex)pLVar6->index,__n - pvVar3->index);
    }
  }
  ::std::
  _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->deleted_columns)._M_h);
  if (local_58 != (LogicalIndex *)0x0) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalIndex> ColumnDependencyManager::CleanupInternals(idx_t column_amount) {
	vector<LogicalIndex> to_adjust;
	D_ASSERT(!deleted_columns.empty());
	// Get the lowest index that was deleted
	vector<LogicalIndex> new_indices(column_amount, LogicalIndex(DConstants::INVALID_INDEX));
	idx_t threshold = deleted_columns.begin()->index;

	idx_t offset = 0;
	for (idx_t i = 0; i < column_amount; i++) {
		auto current_index = LogicalIndex(i);
		auto new_index = LogicalIndex(i - offset);
		new_indices[i] = new_index;
		if (deleted_columns.count(current_index)) {
			offset++;
			continue;
		}
		if (i > threshold && (HasDependencies(current_index) || HasDependents(current_index))) {
			to_adjust.push_back(current_index);
		}
	}

	// Adjust all indices inside the dependency managers internal mappings
	for (auto &col : to_adjust) {
		auto offset = col.index - new_indices[col.index].index;
		AdjustSingle(col, offset);
	}
	deleted_columns.clear();
	return new_indices;
}